

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

double betacdf(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ibeta(x,a,b);
  dVar2 = 1.0;
  if (dVar1 <= 1.0) {
    dVar2 = dVar1;
  }
  return dVar2;
}

Assistant:

double betacdf(double x, double a , double b) {
	
	double oup;
	oup = ibeta(x,a,b);
	// Since ibeta's method 2 uses approximation it is possible that
	// the cdf function thus calculated may slightly overshoot 1.0 probability
	// value so we check for any discrepancies and correct them.
	
	if (oup > 1.0) {
		oup = 1.0;
	}
	return oup;
	
}